

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_lib.cc
# Opt level: O2

void anon_unknown.dwarf_60b5::BandInit(int configuration,_func_int_int_int *Indexing,char *pattern)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 *puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int pick [3];
  int local_68 [2];
  undefined1 local_60 [16];
  long local_48;
  long local_40;
  ulong local_38;
  
  local_68[0] = 0;
  local_68[1] = 0;
  auVar2 = vpinsrd_avx(ZEXT416((uint)(configuration % 6)),
                       (int)((long)((ulong)(uint)((int)((long)configuration / 6) >> 0x1f) << 0x20 |
                                   (long)configuration / 6 & 0xffffffffU) % 6),1);
  auVar2 = vpinsrd_avx(auVar2,(int)((long)((ulong)(uint)((int)((long)configuration / 0x24) >> 0x1f)
                                           << 0x20 | (long)configuration / 0x24 & 0xffffffffU) % 6),
                       2);
  local_60 = vpinsrd_avx(auVar2,(int)((long)((ulong)(uint)((int)((long)configuration / 0xd8) >> 0x1f
                                                          ) << 0x20 |
                                            (long)configuration / 0xd8 & 0xffffffffU) % 6),3);
  pick[0] = (int)((long)((ulong)(uint)((int)((long)configuration / 0x510) >> 0x1f) << 0x20 |
                        (long)configuration / 0x510 & 0xffffffffU) % 3);
  pick[1] = (int)((long)((ulong)(uint)((int)((long)configuration / 0xf30) >> 0x1f) << 0x20 |
                        (long)configuration / 0xf30 & 0xffffffffU) % 3);
  pick[2] = configuration / 0x2d90;
  uVar11 = 0;
  while (uVar13 = uVar11, uVar13 != 3) {
    iVar9 = (int)uVar13;
    if (configuration - 0x88b0U < 0x510) {
      puVar10 = (anonymous_namespace)::permutations;
      for (lVar12 = 0; uVar11 = uVar13 + 1, lVar12 != 3; lVar12 = lVar12 + 1) {
        iVar5 = (*Indexing)((int)((uVar13 + 1 & 0xffffffff) % 3),(int)lVar12);
        cVar1 = pattern[iVar5];
        iVar5 = (*Indexing)(iVar9,*(int *)(puVar10 +
                                          (long)*(int *)(local_60 + uVar13 * 8 + -8) * 0xc) + 3);
        pattern[iVar5] = cVar1;
        iVar5 = (*Indexing)((iVar9 + 2U) % 3,(int)lVar12);
        cVar1 = pattern[iVar5];
        iVar5 = (*Indexing)(iVar9,*(int *)(puVar10 +
                                          (long)*(int *)(local_60 + uVar13 * 8 + -4) * 0xc) + 6);
        puVar10 = puVar10 + 4;
        pattern[iVar5] = cVar1;
      }
    }
    else {
      uVar11 = (ulong)(iVar9 - 1);
      if (uVar13 == 0) {
        uVar11 = 2;
      }
      local_38 = (ulong)(uint)pick[uVar11];
      iVar3 = (int)uVar11;
      iVar6 = (*Indexing)(iVar3,pick[uVar11] % 3);
      iVar5 = pick[uVar13];
      iVar8 = *(int *)(local_60 + uVar13 * 8 + -8);
      cVar1 = pattern[iVar6];
      local_40 = (long)(iVar5 % 3);
      iVar6 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_40 * 4 + (long)iVar8 * 0xc) + 3);
      pattern[iVar6] = cVar1;
      uVar11 = uVar13 + 1 & 0xffffffff;
      if (uVar13 == 2) {
        uVar11 = 0;
      }
      iVar6 = pick[uVar11];
      iVar4 = (int)uVar11;
      iVar7 = (*Indexing)(iVar4,(iVar6 + 1) % 3);
      cVar1 = pattern[iVar7];
      local_48 = (long)((iVar5 + 1) % 3);
      iVar7 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_48 * 4 + (long)iVar8 * 0xc) + 3);
      pattern[iVar7] = cVar1;
      iVar7 = (*Indexing)(iVar4,(iVar6 + 2) % 3);
      cVar1 = pattern[iVar7];
      lVar12 = (long)((iVar5 + 2) % 3);
      iVar5 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        lVar12 * 4 + (long)iVar8 * 0xc) + 3);
      pattern[iVar5] = cVar1;
      iVar8 = (*Indexing)(iVar4,iVar6 % 3);
      iVar5 = *(int *)(local_60 + uVar13 * 8 + -4);
      cVar1 = pattern[iVar8];
      iVar8 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_40 * 4 + (long)iVar5 * 0xc) + 6);
      pattern[iVar8] = cVar1;
      iVar8 = (int)local_38;
      iVar6 = (*Indexing)(iVar3,(iVar8 + 1) % 3);
      cVar1 = pattern[iVar6];
      iVar6 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        local_48 * 4 + (long)iVar5 * 0xc) + 6);
      pattern[iVar6] = cVar1;
      iVar8 = (*Indexing)(iVar3,(iVar8 + 2) % 3);
      cVar1 = pattern[iVar8];
      iVar9 = (*Indexing)(iVar9,*(int *)((anonymous_namespace)::permutations +
                                        lVar12 * 4 + (long)iVar5 * 0xc) + 6);
      pattern[iVar9] = cVar1;
      uVar11 = uVar13 + 1;
    }
  }
  return;
}

Assistant:

void BandInit(int configuration, int (*Indexing)(int, int), char *pattern) {
    int p[3][2] { { 0, 0 },
                  { configuration % 6, (configuration / 6) % 6 },
                  { (configuration / 36) % 6, (configuration / 216) % 6}};
    int picks = configuration / 1296;
    int pick[] { picks % 3, (picks / 3) % 3, picks / 9 };
    for (int i = 0; i < 3; i++) {
        if (picks == 27) {
            for (int j = 0; j < 3; j++) {
                pattern[Indexing(i, permutations[p[i][0]][j] + 3)] = pattern[Indexing((i + 1) % 3, j)];
                pattern[Indexing(i, permutations[p[i][1]][j] + 6)] = pattern[Indexing((i + 2) % 3, j)];
            }
        } else {
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 0) % 3)] + 3)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 1) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][0]][((pick[i] + 2) % 3)] + 3)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 2) % 3)];

            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 0) % 3)] + 6)] = pattern[Indexing((i + 1) % 3, (pick[(i + 1) % 3] + 0) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 1) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 1) % 3)];
            pattern[Indexing(i, permutations[p[i][1]][((pick[i] + 2) % 3)] + 6)] = pattern[Indexing((i + 2) % 3, (pick[(i + 2) % 3] + 2) % 3)];
        }
    }
}